

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_tools.h
# Opt level: O0

void __thiscall
ncnn::SafeOrderList<ncnn::ObjectBox>::pop_front(SafeOrderList<ncnn::ObjectBox> *this)

{
  Mutex *in_RDI;
  MutexLockGuard guard;
  list<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_> *in_stack_fffffffffffffff0;
  
  MutexLockGuard::MutexLockGuard((MutexLockGuard *)in_stack_fffffffffffffff0,in_RDI);
  std::__cxx11::list<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>::pop_front
            (in_stack_fffffffffffffff0);
  MutexLockGuard::~MutexLockGuard((MutexLockGuard *)0x1b9913);
  return;
}

Assistant:

void pop_front()
  {
    MutexLockGuard guard(mutex);
    container.pop_front();
  }